

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O3

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::InvSqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::InvSqrtOp>_>
::~UnaryBuiltinVecFunc
          (UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::InvSqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::InvSqrtOp>_>
           *this)

{
  pointer pSVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__UnaryBuiltinVecFunc_00d31770;
  if (this->m_child != (Expression *)0x0) {
    (*this->m_child->_vptr_Expression[1])();
  }
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->m_value).m_value.
                                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  ValueRange::~ValueRange(&this->m_inValueRange);
  pcVar2 = (this->m_function)._M_dataplus._M_p;
  paVar3 = &(this->m_function).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::~UnaryBuiltinVecFunc (void)
{
	delete m_child;
}